

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGCheckCycles(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,int depth)

{
  xmlRelaxNGType xVar1;
  int iVar2;
  xmlRelaxNGDefinePtr cur_00;
  
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    if (cur == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return 0;
    }
    xVar1 = cur->type;
    if (xVar1 == XML_RELAXNG_ELEMENT) {
      cur_00 = cur->content;
      iVar2 = depth + 1;
LAB_0016f9ad:
      iVar2 = xmlRelaxNGCheckCycles(ctxt,cur_00,iVar2);
    }
    else {
      if ((xVar1 != XML_RELAXNG_PARENTREF) && (xVar1 != XML_RELAXNG_REF)) {
        cur_00 = cur->content;
        iVar2 = depth;
        goto LAB_0016f9ad;
      }
      if (cur->depth == -1) {
        cur->depth = (short)depth;
        iVar2 = xmlRelaxNGCheckCycles(ctxt,cur->content,depth);
        cur->depth = -2;
      }
      else {
        iVar2 = 0;
        if (cur->depth == depth) {
          xmlRngPErr(ctxt,cur->node,1099,"Detected a cycle in %s references\n",cur->name,
                     (xmlChar *)0x0);
          return -1;
        }
      }
    }
    cur = cur->next;
  } while( true );
}

Assistant:

static int
xmlRelaxNGCheckCycles(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr cur, int depth)
{
    int ret = 0;

    while ((ret == 0) && (cur != NULL)) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth == -1) {
                cur->depth = depth;
                ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth);
                cur->depth = -2;
            } else if (depth == cur->depth) {
                xmlRngPErr(ctxt, cur->node, XML_RNGP_REF_CYCLE,
                           "Detected a cycle in %s references\n",
                           cur->name, NULL);
                return (-1);
            }
        } else if (cur->type == XML_RELAXNG_ELEMENT) {
            ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth + 1);
        } else {
            ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth);
        }
        cur = cur->next;
    }
    return (ret);
}